

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcShaderIndexingTests.cpp
# Opt level: O2

void deqp::evalArrayCoordsVec3(ShaderEvalContext *c)

{
  Vector<float,_3> local_40;
  tcu local_34 [12];
  VecAccess<float,_4,_3> local_28;
  
  local_40.m_data[2] = (c->coords).m_data[2];
  local_40.m_data._0_8_ = *(undefined8 *)(c->coords).m_data;
  tcu::operator*(local_34,1.875,&local_40);
  local_28.m_vector = &c->color;
  local_28.m_index[0] = 0;
  local_28.m_index[1] = 1;
  local_28.m_index[2] = 2;
  tcu::VecAccess<float,_4,_3>::operator=(&local_28,(Vector<float,_3> *)local_34);
  return;
}

Assistant:

void evalArrayCoordsVec3(ShaderEvalContext& c)
{
	c.color.xyz() = 1.875f * c.coords.swizzle(0, 1, 2);
}